

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# arkode_io.c
# Opt level: O2

int ARKodeGetNumSteps(void *arkode_mem,long *nsteps)

{
  int iVar1;
  
  if (arkode_mem == (void *)0x0) {
    iVar1 = -0x15;
    arkProcessError((ARKodeMem)0x0,-0x15,0x7e2,"ARKodeGetNumSteps",
                    "/workspace/llm4binary/github/license_all_cmakelists_25/opencor[P]sundials/src/arkode/arkode_io.c"
                    ,"arkode_mem = NULL illegal.");
  }
  else {
    *nsteps = *(long *)((long)arkode_mem + 0x310);
    iVar1 = 0;
  }
  return iVar1;
}

Assistant:

int ARKodeGetNumSteps(void* arkode_mem, long int* nsteps)
{
  ARKodeMem ark_mem;
  if (arkode_mem == NULL)
  {
    arkProcessError(NULL, ARK_MEM_NULL, __LINE__, __func__, __FILE__,
                    MSG_ARK_NO_MEM);
    return (ARK_MEM_NULL);
  }
  ark_mem = (ARKodeMem)arkode_mem;

  *nsteps = ark_mem->nst;
  return (ARK_SUCCESS);
}